

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O1

string * __thiscall
flatbuffers::php::PhpGenerator::GenDefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,PhpGenerator *this,Value *value)

{
  BaseType BVar1;
  EnumDef *pEVar2;
  pointer pcVar3;
  int iVar4;
  EnumVal *pEVar5;
  long *plVar6;
  int *piVar7;
  longlong lVar8;
  long *plVar9;
  size_type *psVar10;
  char *pcVar11;
  char *pcVar12;
  long lVar13;
  char *endptr;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  string local_50;
  
  pEVar2 = (value->type).enum_def;
  if ((pEVar2 != (EnumDef *)0x0) &&
     (pEVar5 = EnumDef::FindByValue(pEVar2,&value->constant), pEVar5 != (EnumVal *)0x0)) {
    pEVar2 = (value->type).enum_def;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
    BaseGenerator::WrapInNameSpace
              (&local_50,&this->super_BaseGenerator,&pEVar2->super_Definition,&local_70);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
    plVar9 = plVar6 + 2;
    if ((long *)*plVar6 == plVar9) {
      local_80 = *plVar9;
      lStack_78 = plVar6[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar9;
      local_90 = (long *)*plVar6;
    }
    local_88 = plVar6[1];
    *plVar6 = (long)plVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_90,(ulong)(pEVar5->name)._M_dataplus._M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar10 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar10) {
      lVar13 = plVar6[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar13;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
    }
    __return_storage_ptr__->_M_string_length = plVar6[1];
    *plVar6 = (long)psVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (pEVar5 != (EnumVal *)0x0) {
      return __return_storage_ptr__;
    }
  }
  BVar1 = (value->type).base_type;
  if (BVar1 - BASE_TYPE_LONG < 2) {
    iVar4 = std::__cxx11::string::compare((char *)&value->constant);
    if (iVar4 != 0) {
      plVar6 = (long *)(value->constant)._M_dataplus._M_p;
      if (plVar6 != (long *)0x0) {
        piVar7 = __errno_location();
        *piVar7 = 0;
        local_90 = plVar6;
        lVar8 = strtoll_l((char *)plVar6,(char **)&local_90,10,ClassicLocale::instance_);
        lVar13 = 0;
        if (((local_90 != plVar6) && ((char)*local_90 == '\0')) && (lVar13 = 0, *piVar7 == 0)) {
          lVar13 = lVar8;
        }
        NumToString<long>(__return_storage_ptr__,lVar13);
        return __return_storage_ptr__;
      }
      __assert_fail("str",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/util.h"
                    ,0x11f,
                    "bool flatbuffers::StringToIntegerImpl(T *, const char *const, const int, const bool) [T = long]"
                   );
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar12 = "0";
    pcVar11 = "";
  }
  else if (BVar1 == BASE_TYPE_STRING) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar12 = "null";
    pcVar11 = "";
  }
  else {
    if (BVar1 != BASE_TYPE_BOOL) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = (value->constant)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar3,pcVar3 + (value->constant)._M_string_length
                );
      return __return_storage_ptr__;
    }
    iVar4 = std::__cxx11::string::compare((char *)&value->constant);
    pcVar12 = "true";
    if (iVar4 == 0) {
      pcVar12 = "false";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar11 = pcVar12 + (ulong)(iVar4 == 0) + 4;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar12,pcVar11);
  return __return_storage_ptr__;
}

Assistant:

std::string GenDefaultValue(const Value &value) {
    if (value.type.enum_def) {
      if (auto val = value.type.enum_def->FindByValue(value.constant)) {
        return WrapInNameSpace(*value.type.enum_def) + "::" + val->name;
      }
    }

    switch (value.type.base_type) {
      case BASE_TYPE_BOOL: return value.constant == "0" ? "false" : "true";

      case BASE_TYPE_STRING: return "null";

      case BASE_TYPE_LONG:
      case BASE_TYPE_ULONG:
        if (value.constant != "0") {
          int64_t constant = StringToInt(value.constant.c_str());
          return NumToString(constant);
        }
        return "0";

      default: return value.constant;
    }
  }